

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O0

void atommem_d(disctx *ctx,ull *a,ull *m,void *v)

{
  int iVar1;
  undefined8 uVar2;
  easm_expr *peVar3;
  ull uVar4;
  char *pcVar5;
  easm_mods *peVar6;
  litem **pplVar7;
  litem *plVar8;
  easm_expr *local_70;
  easm_expr *nex;
  easm_expr *ssexpr;
  uint64_t num;
  easm_expr *sexpr;
  easm_expr *imm;
  easm_expr *pexpr;
  easm_expr *expr;
  int type;
  mem *mem;
  void *v_local;
  ull *m_local;
  ull *a_local;
  disctx *ctx_local;
  
  expr._4_4_ = EASM_EXPR_MEM;
  pexpr = (easm_expr *)0x0;
  imm = (easm_expr *)0x0;
  if (*(long *)((long)v + 0x10) != 0) {
    pexpr = printreg(ctx,a,m,*(reg **)((long)v + 0x10));
  }
  peVar3 = pexpr;
  if (*(long *)((long)v + 0x18) != 0) {
    peVar3 = getrbf(*(rbitfield **)((long)v + 0x18),a,m);
    if (*(int *)((long)v + 0x2c) == 0) {
      if (pexpr != (easm_expr *)0x0) {
        peVar3 = easm_expr_bin(EASM_EXPR_ADD,pexpr,peVar3);
      }
    }
    else {
      expr._4_4_ = EASM_EXPR_MEMPP;
      imm = peVar3;
      peVar3 = pexpr;
    }
  }
  pexpr = peVar3;
  if ((*(long *)((long)v + 0x20) != 0) &&
     (num = (uint64_t)printreg(ctx,a,m,*(reg **)((long)v + 0x20)),
     (easm_expr *)num != (easm_expr *)0x0)) {
    if (*(int *)((long)v + 0x28) != 0) {
      peVar3 = easm_expr_num(EASM_EXPR_NUM,1L << ((byte)*(undefined4 *)((long)v + 0x28) & 0x3f));
      num = (uint64_t)easm_expr_bin(EASM_EXPR_MUL,(easm_expr *)num,peVar3);
    }
    if (pexpr == (easm_expr *)0x0) {
      pexpr = (easm_expr *)num;
    }
    else {
      pexpr = easm_expr_bin(EASM_EXPR_ADD,pexpr,(easm_expr *)num);
    }
  }
  if (pexpr == (easm_expr *)0x0) {
    pexpr = easm_expr_num(EASM_EXPR_NUM,0);
  }
  if (*v == 0) {
    if (expr._4_4_ != EASM_EXPR_MEM) {
      abort();
    }
  }
  else {
    if (imm == (easm_expr *)0x0) {
      local_70 = easm_expr_un(expr._4_4_,pexpr);
    }
    else {
      local_70 = easm_expr_bin(expr._4_4_,pexpr,imm);
    }
    if (*(long *)((long)v + 8) == 0) {
      pcVar5 = strdup(*v);
      local_70->str = pcVar5;
    }
    else {
      uVar2 = *v;
      uVar4 = getbf(*(bitfield **)((long)v + 8),a,m);
      pcVar5 = aprintf("%s%lld",uVar2,uVar4);
      local_70->str = pcVar5;
    }
    peVar6 = (easm_mods *)calloc(0x28,1);
    local_70->mods = peVar6;
    pexpr = local_70;
  }
  if ((*(int *)((long)v + 0x30) != 0) && (pexpr->type == EASM_EXPR_MEM)) {
    pexpr->special = EASM_SPEC_LITERAL;
  }
  if (ctx->atomsmax <= ctx->atomsnum) {
    if (ctx->atomsmax == 0) {
      ctx->atomsmax = 0x10;
    }
    else {
      ctx->atomsmax = ctx->atomsmax << 1;
    }
    pplVar7 = (litem **)realloc(ctx->atoms,(long)ctx->atomsmax << 3);
    ctx->atoms = pplVar7;
  }
  plVar8 = makeli(pexpr);
  iVar1 = ctx->atomsnum;
  ctx->atomsnum = iVar1 + 1;
  ctx->atoms[iVar1] = plVar8;
  return;
}

Assistant:

void atommem_d DPROTO {
	const struct mem *mem = v;
	int type = EASM_EXPR_MEM;
	struct easm_expr *expr = 0;
	struct easm_expr *pexpr = 0;
	if (mem->reg)
		expr = printreg(ctx, a, m, mem->reg);
	if (mem->imm) {
		struct easm_expr *imm = GETRBF(mem->imm);
		if (mem->postincr) {
			type = EASM_EXPR_MEMPP;
			pexpr = imm;
		} else {
			if (expr) {
				expr = easm_expr_bin(EASM_EXPR_ADD, expr, imm);
			} else {
				expr = imm;
			}
		}
	}
	if (mem->reg2) {
		struct easm_expr *sexpr = printreg(ctx, a, m, mem->reg2);
		if (sexpr) {
			if (mem->reg2shr) {
				uint64_t num = 1ull << mem->reg2shr;
				struct easm_expr *ssexpr = easm_expr_num(EASM_EXPR_NUM, num);
				sexpr = easm_expr_bin(EASM_EXPR_MUL, sexpr, ssexpr);
			}
			if (expr)
				expr = easm_expr_bin(EASM_EXPR_ADD, expr, sexpr);
			else
				expr = sexpr;
		}
	}
	if (!expr) expr = easm_expr_num(EASM_EXPR_NUM, 0);
	if (mem->name) {
		struct easm_expr *nex;
		if (pexpr)
			nex = easm_expr_bin(type, expr, pexpr);
		else
			nex = easm_expr_un(type, expr);
		if (mem->idx)
			nex->str = aprintf("%s%lld", mem->name, GETBF(mem->idx));
		else
			nex->str = strdup(mem->name);
		nex->mods = calloc(sizeof *nex->mods, 1);
		expr = nex;
	} else if (type != EASM_EXPR_MEM) {
		abort();
	}
	if (mem->literal && expr->type == EASM_EXPR_MEM)
		expr->special = EASM_SPEC_LITERAL;
	ADDARRAY(ctx->atoms, makeli(expr));
}